

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::SharedBasicVarCase::iterate(SharedBasicVarCase *this)

{
  pointer *ppfVar1;
  GLuint program;
  DataType DVar2;
  Precision PVar3;
  uint uVar4;
  uint uVar5;
  GLint GVar6;
  int iVar7;
  GLuint index;
  GLint GVar8;
  GLint GVar9;
  GLint GVar10;
  int iVar11;
  GLenum GVar12;
  undefined4 extraout_var;
  glUniform1fvFunc *pp_Var13;
  glUniform1uivFunc *pp_Var14;
  glUniform1ivFunc *pp_Var15;
  pointer pfVar16;
  void *pvVar17;
  glUniformMatrix2fvFunc *pp_Var18;
  TestError *this_00;
  ulong uVar19;
  char *description;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  pointer *this_01;
  bool bVar27;
  allocator_type local_2a1;
  Functions *local_2a0;
  glUniformMatrix4fvFunc *local_298;
  glUniformMatrix4fvFunc *local_290;
  glUniformMatrix4fvFunc *local_288;
  glUniformMatrix4fvFunc *local_280;
  glUniformMatrix4fvFunc *local_278;
  glUniformMatrix4fvFunc *local_270;
  glUniformMatrix4fvFunc *local_268;
  Buffer outputBuffer;
  Random rnd;
  uint local_214;
  int local_210;
  vector<float,_std::allocator<float>_> values;
  InterfaceBlockInfo outBlockInfo;
  Functions *gl;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  program = (this->m_program->m_program).m_program;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  index = (*gl->getProgramResourceIndex)(program,0x92e6,"Result");
  glu::getProgramInterfaceBlockInfo(&outBlockInfo,gl,program,0x92e6,index);
  (*gl->useProgram)(program);
  iVar7 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[2] *
          (this->m_workGroupSize).m_data[0];
  GVar8 = (*gl->getUniformLocation)(program,"u_val[0]");
  GVar9 = (*gl->getUniformLocation)(program,"u_ref[0]");
  GVar10 = (*gl->getUniformLocation)(program,"u_numIters");
  iVar11 = glu::getDataTypeScalarSize(this->m_basicType);
  DVar2 = this->m_basicType;
  local_2a0 = gl;
  if (DVar2 - TYPE_FLOAT < 4) {
    iVar24 = 2;
    iVar25 = 0x400;
    if (this->m_precision == PRECISION_LOWP) {
      iVar25 = 2;
    }
    iVar20 = iVar7 / 2;
    if (iVar25 <= iVar7 / 2) {
      iVar20 = iVar25;
    }
    std::vector<float,_std::allocator<float>_>::vector
              (&values,(long)(iVar11 * iVar7),(allocator_type *)&rnd);
    uVar22 = (ulong)((long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar19 = 0;
    uVar21 = uVar22 & 0xffffffff;
    if ((int)uVar22 < 1) {
      uVar21 = uVar19;
    }
    for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar19] =
           (float)((int)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) %
                        (long)(iVar20 + iVar25 + 1)) - iVar20);
    }
switchD_011fd899_default:
    bVar27 = iVar24 == 0;
    iVar24 = iVar24 + -1;
    if (bVar27) goto LAB_011fd8ba;
    GVar6 = GVar8;
    if (iVar24 == 0) {
      GVar6 = GVar9;
    }
    pp_Var13 = &gl->uniform1fv;
    switch(iVar11) {
    case 1:
      break;
    case 2:
      pp_Var13 = &gl->uniform2fv;
      break;
    case 3:
      pp_Var13 = &gl->uniform3fv;
      break;
    case 4:
      pp_Var13 = &gl->uniform4fv;
      break;
    default:
      goto switchD_011fd899_default;
    }
    (**pp_Var13)(GVar6,iVar7,
                 values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
    goto switchD_011fd899_default;
  }
  if (DVar2 - TYPE_INT < 4) {
    iVar24 = 0x400;
    if (this->m_precision == PRECISION_LOWP) {
      iVar24 = 0x40;
    }
    iVar25 = 2;
    iVar20 = iVar7 / 2;
    if (iVar24 <= iVar7 / 2) {
      iVar20 = iVar24;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&values,(long)(iVar11 * iVar7),
               (allocator_type *)&rnd);
    uVar22 = (ulong)((long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar19 = 0;
    uVar21 = uVar22 & 0xffffffff;
    if ((int)uVar22 < 1) {
      uVar21 = uVar19;
    }
    for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar19] =
           (float)((int)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) %
                        (long)(iVar20 + iVar24 + 1)) - iVar20);
    }
switchD_011fd991_default:
    bVar27 = iVar25 == 0;
    iVar25 = iVar25 + -1;
    if (bVar27) goto LAB_011fdbcf;
    GVar6 = GVar8;
    if (iVar25 == 0) {
      GVar6 = GVar9;
    }
    pp_Var15 = &gl->uniform1iv;
    switch(iVar11) {
    case 1:
      break;
    case 2:
      pp_Var15 = &gl->uniform2iv;
      break;
    case 3:
      pp_Var15 = &gl->uniform3iv;
      break;
    case 4:
      pp_Var15 = &gl->uniform4iv;
      break;
    default:
      goto switchD_011fd991_default;
    }
    (**pp_Var15)(GVar6,iVar7,
                 (GLint *)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    goto switchD_011fd991_default;
  }
  if (DVar2 - TYPE_UINT < 4) {
    PVar3 = this->m_precision;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&values,(long)(iVar11 * iVar7)
               ,(allocator_type *)&rnd);
    uVar21 = (ulong)((long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar23 = 0x401;
    if (PVar3 == PRECISION_LOWP) {
      uVar23 = 0x81;
    }
    uVar22 = 0;
    uVar19 = uVar21 & 0xffffffff;
    if ((int)uVar21 < 1) {
      uVar19 = uVar22;
    }
    for (; uVar19 != uVar22; uVar22 = uVar22 + 1) {
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar22] = (float)((uVar22 & 0xffffffff) % (ulong)uVar23);
    }
    iVar24 = 2;
switchD_011fda87_default:
    bVar27 = iVar24 == 0;
    iVar24 = iVar24 + -1;
    if (bVar27) goto LAB_011fdaa8;
    GVar6 = GVar8;
    if (iVar24 == 0) {
      GVar6 = GVar9;
    }
    pp_Var14 = &gl->uniform1uiv;
    switch(iVar11) {
    case 1:
      break;
    case 2:
      pp_Var14 = &gl->uniform2uiv;
      break;
    case 3:
      pp_Var14 = &gl->uniform3uiv;
      break;
    case 4:
      pp_Var14 = &gl->uniform4uiv;
      break;
    default:
      goto switchD_011fda87_default;
    }
    (**pp_Var14)(GVar6,iVar7,
                 (GLuint *)
                 values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
    goto switchD_011fda87_default;
  }
  if (DVar2 - TYPE_BOOL < 4) {
    deRandom_init(&rnd.m_rnd,0x324f);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&values,(long)(iVar11 * iVar7),&local_2a1);
    for (lVar26 = 0;
        lVar26 < (int)((ulong)((long)values.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                    .super__Vector_impl_data._M_start) >> 2); lVar26 = lVar26 + 1) {
      bVar27 = de::Random::getBool(&rnd);
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar26] = (float)(uint)bVar27;
    }
    iVar24 = 2;
switchD_011fdbae_default:
    bVar27 = iVar24 == 0;
    iVar24 = iVar24 + -1;
    if (bVar27) goto LAB_011fdbcf;
    GVar6 = GVar8;
    if (iVar24 == 0) {
      GVar6 = GVar9;
    }
    pp_Var15 = &gl->uniform1iv;
    switch(iVar11) {
    case 1:
      break;
    case 2:
      pp_Var15 = &gl->uniform2iv;
      break;
    case 3:
      pp_Var15 = &gl->uniform3iv;
      break;
    case 4:
      pp_Var15 = &gl->uniform4iv;
      break;
    default:
      goto switchD_011fdbae_default;
    }
    (**pp_Var15)(GVar6,iVar7,
                 (GLint *)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    goto switchD_011fdbae_default;
  }
  if (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9) {
    iVar24 = 2;
    iVar25 = 0x400;
    if (this->m_precision == PRECISION_LOWP) {
      iVar25 = 2;
    }
    iVar20 = iVar7 / 2;
    if (iVar25 <= iVar7 / 2) {
      iVar20 = iVar25;
    }
    std::vector<float,_std::allocator<float>_>::vector
              (&values,(long)(iVar11 * iVar7),(allocator_type *)&rnd);
    uVar22 = (ulong)((long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar19 = 0;
    uVar21 = uVar22 & 0xffffffff;
    if ((int)uVar22 < 1) {
      uVar21 = uVar19;
    }
    for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar19] =
           (float)((int)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) %
                        (long)(iVar20 + iVar25 + 1)) - iVar20);
    }
    local_268 = &gl->uniformMatrix4x3fv;
    local_270 = &gl->uniformMatrix4x2fv;
    local_278 = &gl->uniformMatrix3x4fv;
    local_280 = &gl->uniformMatrix3fv;
    local_288 = &gl->uniformMatrix3x2fv;
    local_290 = &gl->uniformMatrix2x4fv;
    local_298 = &gl->uniformMatrix2x3fv;
switchD_011fe045_default:
    bVar27 = iVar24 == 0;
    iVar24 = iVar24 + -1;
    if (bVar27) goto LAB_011fe08f;
    GVar6 = GVar8;
    if (iVar24 == 0) {
      GVar6 = GVar9;
    }
    pp_Var18 = &gl->uniformMatrix2fv;
    switch(this->m_basicType) {
    case TYPE_FLOAT_MAT2:
      break;
    case TYPE_FLOAT_MAT2X3:
      pp_Var18 = local_298;
      break;
    case TYPE_FLOAT_MAT2X4:
      pp_Var18 = local_290;
      break;
    case TYPE_FLOAT_MAT3X2:
      pp_Var18 = local_288;
      break;
    case TYPE_FLOAT_MAT3:
      pp_Var18 = local_280;
      break;
    case TYPE_FLOAT_MAT3X4:
      pp_Var18 = local_278;
      break;
    case TYPE_FLOAT_MAT4X2:
      pp_Var18 = local_270;
      break;
    case TYPE_FLOAT_MAT4X3:
      pp_Var18 = local_268;
      break;
    case TYPE_FLOAT_MAT4:
      pp_Var18 = &gl->uniformMatrix4fv;
      break;
    default:
      goto switchD_011fe045_default;
    }
    (**pp_Var18)(GVar6,iVar7,'\0',
                 values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
    goto switchD_011fe045_default;
  }
LAB_011fdbf0:
  (*gl->uniform1ui)(GVar10,(this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[2] *
                           (this->m_workGroupSize).m_data[0]);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"Input value setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x12a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&values,
             (ulong)outBlockInfo.dataSize,(allocator_type *)&rnd);
  for (pfVar16 = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pfVar16 !=
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish; pfVar16 = (pointer)((long)pfVar16 + 1)) {
    *(undefined1 *)pfVar16 = 0;
  }
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(ulong)outBlockInfo.dataSize,
                    values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,0x88e5);
  (*gl->bindBufferBase)(0x90d2,0,outputBuffer.super_ObjectWrapper.m_object);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x135);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&values);
  (*gl->dispatchCompute)(1,1,1);
  uVar23 = (this->m_workGroupSize).m_data[1];
  uVar4 = (this->m_workGroupSize).m_data[2];
  uVar5 = (this->m_workGroupSize).m_data[0];
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&rnd,gl,program,0x92e5,
             *outBlockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start);
  pvVar17 = (*gl->mapBufferRange)(0x90d2,0,(ulong)outBlockInfo.dataSize,1);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x142);
  if (pvVar17 == (void *)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"resPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
               ,0x143);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  ppfVar1 = &values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  iVar7 = 0;
  for (uVar21 = 0;
      this_01 = &values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish, uVar23 * uVar4 * uVar5 != uVar21;
      uVar21 = uVar21 + 1) {
    if (*(int *)((long)pvVar17 + (ulong)(uint)(local_210 * (int)uVar21) + (ulong)local_214) == 0) {
      if (iVar7 < 10) {
        values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar1);
        std::operator<<((ostream *)ppfVar1,"ERROR: isOk[");
        std::ostream::_M_insert<unsigned_long>((ulong)ppfVar1);
        std::operator<<((ostream *)ppfVar1,"] = ");
        std::ostream::operator<<(ppfVar1,0);
        std::operator<<((ostream *)ppfVar1," != true");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&values,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar1);
      }
      else if (iVar7 == 10) {
        values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
        std::operator<<((ostream *)this_01,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&values,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      iVar7 = iVar7 + 1;
    }
  }
  (*local_2a0->unmapBuffer)(0x90d2);
  GVar12 = (*local_2a0->getError)();
  glu::checkError(GVar12,"glUnmapBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x155);
  values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppfVar1 = &values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)ppfVar1);
  std::operator<<((ostream *)ppfVar1," / ");
  std::ostream::_M_insert<unsigned_long>((ulong)ppfVar1);
  std::operator<<((ostream *)ppfVar1," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&values,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar1);
  description = "Pass";
  if (iVar7 != 0) {
    description = "Comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar7 != 0),
             description);
  std::__cxx11::string::~string((string *)&rnd);
  glu::InterfaceBlockInfo::~InterfaceBlockInfo(&outBlockInfo);
  glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
  return STOP;
LAB_011fdaa8:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&values);
  gl = local_2a0;
  goto LAB_011fdbf0;
LAB_011fe08f:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&values.super__Vector_base<float,_std::allocator<float>_>);
  goto LAB_011fdbf0;
LAB_011fdbcf:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&values);
  gl = local_2a0;
  goto LAB_011fdbf0;
LAB_011fd8ba:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&values.super__Vector_base<float,_std::allocator<float>_>);
  gl = local_2a0;
  goto LAB_011fdbf0;
}

Assistant:

SharedBasicVarCase::IterateResult SharedBasicVarCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	Buffer						outputBuffer	(m_context.getRenderContext());
	const deUint32				outBlockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "Result");
	const InterfaceBlockInfo	outBlockInfo	= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, outBlockNdx);

	gl.useProgram(program);

	// Setup input values.
	{
		const int		numValues		= (int)product(m_workGroupSize);
		const int		valLoc			= gl.getUniformLocation(program, "u_val[0]");
		const int		refLoc			= gl.getUniformLocation(program, "u_ref[0]");
		const int		iterCountLoc	= gl.getUniformLocation(program, "u_numIters");
		const int		scalarSize		= getDataTypeScalarSize(m_basicType);

		if (isDataTypeFloatOrVec(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 2 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<float>	values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = float(minInt + (ndx % (maxInt-minInt+1)));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1fv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2fv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3fv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4fv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeIntOrIVec(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 64 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<int>		values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = minInt + (ndx % (maxInt-minInt+1));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1iv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2iv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3iv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4iv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeUintOrUVec(m_basicType))
		{
			const deUint32		maxInt		= m_precision == glu::PRECISION_LOWP ? 128 : 1024;
			vector<deUint32>	values		(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = ndx % (maxInt+1);

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1uiv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2uiv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3uiv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4uiv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeBoolOrBVec(m_basicType))
		{
			de::Random		rnd				(0x324f);
			vector<int>		values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = rnd.getBool() ? 1 : 0;

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1iv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2iv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3iv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4iv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeMatrix(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 2 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<float>	values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = float(minInt + (ndx % (maxInt-minInt+1)));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				switch (m_basicType)
				{
					case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv  (location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv  (location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv  (location, numValues, DE_FALSE, &values[0]);	break;
					default:
						DE_ASSERT(false);
				}
			}
		}

		gl.uniform1ui(iterCountLoc, product(m_workGroupSize));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Input value setup failed");
	}

	// Setup output buffer.
	{
		vector<deUint8> emptyData(outBlockInfo.dataSize);
		std::fill(emptyData.begin(), emptyData.end(), 0);

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, outBlockInfo.dataSize, &emptyData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(1, 1, 1);

	// Read back and compare
	{
		const deUint32				numValues	= product(m_workGroupSize);
		const InterfaceVariableInfo	outVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outBlockInfo.activeVariables[0]);
		const void*					resPtr		= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, outBlockInfo.dataSize, GL_MAP_READ_BIT);
		const int					maxErrMsg	= 10;
		int							numFailed	= 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
		{
			const int resVal = *((const int*)((const deUint8*)resPtr + outVarInfo.offset + outVarInfo.arrayStride*ndx));

			if (resVal == 0)
			{
				if (numFailed < maxErrMsg)
					m_testCtx.getLog() << TestLog::Message << "ERROR: isOk[" << ndx << "] = " << resVal << " != true" << TestLog::EndMessage;
				else if (numFailed == maxErrMsg)
					m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.getLog() << TestLog::Message << (numValues-numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

		m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								numFailed == 0 ? "Pass"					: "Comparison failed");
	}

	return STOP;
}